

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O0

bool __thiscall CPath::create_directory_recursive(CPath *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *local_50;
  char *sep;
  char *ts;
  path tp;
  CPath *this_local;
  
  tp._32_8_ = this;
  std::filesystem::__cxx11::path::path((path *)&ts);
  sep = std::filesystem::__cxx11::path::c_str(&this->super_path);
  local_50 = sep;
  if (*sep == '/') {
    local_50 = sep + 1;
  }
  do {
    if (*local_50 == '\0') {
      this_local._7_1_ = true;
LAB_002333a0:
      std::filesystem::__cxx11::path::~path((path *)&ts);
      return this_local._7_1_;
    }
    pcVar3 = strchr(local_50,0x2f);
    if (pcVar3 == (char *)0x0) {
      std::filesystem::__cxx11::path::assign<char*>((path *)&ts,&sep);
      bVar1 = std::filesystem::exists((path *)&ts);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        bVar2 = std::filesystem::create_directory((path *)&ts);
        this_local._7_1_ = (bool)(bVar2 & 1);
      }
      goto LAB_002333a0;
    }
    *pcVar3 = '\0';
    std::filesystem::__cxx11::path::assign<char*>((path *)&ts,&sep);
    bVar1 = std::filesystem::exists((path *)&ts);
    if ((!bVar1) && (bVar2 = std::filesystem::create_directory((path *)&ts), (bVar2 & 1) == 0)) {
      this_local._7_1_ = false;
      goto LAB_002333a0;
    }
    *pcVar3 = '/';
    local_50 = pcVar3 + 1;
  } while( true );
}

Assistant:

bool create_directory_recursive()
	{
		fs::path tp;
		char* ts = const_cast<char*>(c_str());
		char* sep = ts;

		// Пропускаем корневой каталог, если он указан. Его мы не создадим.
		if(*sep == preferred_separator) sep++;

		while(*sep != '\0')
		{
			sep = strchr(sep, preferred_separator);
			if(sep != nullptr)
			{
				*sep = '\0';
				tp.assign(ts);
				if(!fs::exists(tp))
				{
					if(!fs::create_directory(tp))
						return false;
				}

				*sep = preferred_separator;
				sep++;
			}
			else
			{
				tp.assign(ts);
				if(fs::exists(tp))
					return true;

				return fs::create_directory(tp);
			}
		}

		return true;
	}